

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

cali_id_t cali_make_loop_iteration_attribute(char *name)

{
  string *name_00;
  Attribute AVar1;
  cali_id_t cVar2;
  Variant v_true;
  Caliper c;
  long *local_68 [2];
  long local_58 [2];
  Variant local_48;
  Caliper local_38;
  
  local_48.m_v.type_and_size = 7;
  local_48.m_v.value.v_uint = 1;
  cali::Caliper::Caliper(&local_38);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"iteration#","");
  name_00 = (string *)std::__cxx11::string::append((char *)local_68);
  AVar1 = cali::Caliper::create_attribute
                    (&local_38,name_00,CALI_TYPE_INT,1,1,(Attribute *)&cali::class_iteration_attr,
                     &local_48);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (AVar1.m_node == (Node *)0x0) {
    cVar2 = 0xffffffffffffffff;
  }
  else {
    cVar2 = (AVar1.m_node)->m_id;
  }
  return cVar2;
}

Assistant:

cali_id_t cali_make_loop_iteration_attribute(const char* name)
{
    Variant v_true(true);

    Caliper   c;
    Attribute attr = c.create_attribute(
        std::string("iteration#").append(name),
        CALI_TYPE_INT,
        CALI_ATTR_ASVALUE,
        1,
        &class_iteration_attr,
        &v_true
    );

    return attr.id();
}